

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::WeightParams::InternalSwap(WeightParams *this,WeightParams *other)

{
  WeightParams *other_local;
  WeightParams *this_local;
  
  google::protobuf::RepeatedField<float>::InternalSwap(&this->floatvalue_,&other->floatvalue_);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &this->float16value_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &other->float16value_);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&this->rawvalue_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&other->rawvalue_
            );
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &this->int8rawvalue_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &other->int8rawvalue_);
  std::swap<CoreML::Specification::QuantizationParams*>(&this->quantization_,&other->quantization_);
  std::swap<bool>(&this->isupdatable_,&other->isupdatable_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void WeightParams::InternalSwap(WeightParams* other) {
  floatvalue_.InternalSwap(&other->floatvalue_);
  float16value_.Swap(&other->float16value_);
  rawvalue_.Swap(&other->rawvalue_);
  int8rawvalue_.Swap(&other->int8rawvalue_);
  std::swap(quantization_, other->quantization_);
  std::swap(isupdatable_, other->isupdatable_);
  std::swap(_cached_size_, other->_cached_size_);
}